

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall
cppcms::json::bad_value_cast::bad_value_cast
          (bad_value_cast *this,string *s,json_type expected,json_type actual)

{
  ostringstream msg;
  undefined1 *local_1c0;
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  *(code **)&this->super_bad_cast = __cxa_guard_abort;
  booster::backtrace::backtrace(&(this->super_bad_cast).super_backtrace,0x20);
  *(undefined ***)&this->super_bad_cast = &PTR__bad_value_cast_00112be8;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__bad_value_cast_00112c10;
  std::operator+(&this->msg_,"cppcms::json::bad_cast: ",s);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0," error converting from ",0x17);
  operator<<((ostream *)local_1a0,actual);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," to ",4);
  operator<<((ostream *)local_1a0,expected);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->msg_,(ulong)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

bad_value_cast::bad_value_cast(std::string const &s,json_type expected, json_type actual) : 
		msg_("cppcms::json::bad_cast: " + s)
	{
		std::ostringstream msg;
		msg<<" error converting from "<<actual<<" to "<<expected;
		msg_ +=msg.str();

	}